

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChDistribution.cpp
# Opt level: O2

void __thiscall
chrono::ChDiscreteDistribution::ChDiscreteDistribution
          (ChDiscreteDistribution *this,ChVectorDynamic<> *mx,ChVectorDynamic<> *my)

{
  ChVectorDynamic<> *this_00;
  double dVar1;
  Scalar *pSVar2;
  ChException *this_01;
  int i;
  long lVar3;
  long lVar4;
  allocator local_61;
  double local_60;
  double local_58;
  string local_50;
  
  (this->super_ChDistribution)._vptr_ChDistribution =
       (_func_int **)&PTR__ChDiscreteDistribution_0114edf8;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&this->x,(DenseStorage<double,__1,__1,_1,_0> *)mx
            );
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&this->y,(DenseStorage<double,__1,__1,_1,_0> *)my
            );
  this_00 = &this->cdf_y;
  (this->cdf_y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->cdf_y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  if ((mx->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows ==
      (my->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>(this_00,my)
    ;
    local_60 = 0.0;
    lVar3 = 0;
    while( true ) {
      lVar4 = (this->x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows;
      if (lVar4 <= lVar3) break;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&this->y,
                          lVar3);
      local_58 = *pSVar2;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                          lVar3);
      lVar3 = lVar3 + 1;
      local_60 = local_60 + local_58;
      *pSVar2 = local_60;
    }
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                        lVar4 + -1);
    dVar1 = *pSVar2;
    if ((dVar1 != 1.0) || (NAN(dVar1))) {
      local_60 = 1.0 / dVar1;
      for (lVar4 = 0;
          lVar3 = (this->x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                  .m_rows, lVar4 < lVar3; lVar4 = lVar4 + 1) {
        pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                            lVar4);
        *pSVar2 = local_60 * *pSVar2;
      }
    }
    else {
      lVar3 = (this->x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows;
    }
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                        lVar3 + -1);
    *pSVar2 = 1.0;
    return;
  }
  this_01 = (ChException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_50,"Probability values and percentages must have the same size",
             &local_61);
  ChException::ChException(this_01,&local_50);
  __cxa_throw(this_01,&ChException::typeinfo,ChException::~ChException);
}

Assistant:

ChDiscreteDistribution::ChDiscreteDistribution(ChVectorDynamic<>& mx, ChVectorDynamic<>& my) : x(mx), y(my) {
    if (mx.size() != my.size())
        throw ChException("Probability values and percentages must have the same size");

    cdf_y = my;

    // compute CDF
    double integral = 0;
    for (int i = 0; i < x.size(); i++) {
        integral += y(i);
        cdf_y(i) = integral;
    }
    // normalize if P(x) had not unit integral
    double totintegral = cdf_y(x.size() - 1);
    if (totintegral != 1.0) {
        for (int i = 0; i < x.size(); i++) {
            cdf_y(i) *= 1. / totintegral;
        }
    }
    cdf_y(x.size() - 1) = 1.0;
}